

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void duckdb_je_base_delete(tsdn_t *tsdn,base_t *base)

{
  base_block_t *pbVar1;
  base_block_t *pbVar2;
  size_t in_R8;
  
  pbVar2 = base->blocks;
  do {
    pbVar1 = pbVar2->next;
    base_unmap(tsdn,&base->ehooks_base,(uint)pbVar2,(void *)pbVar2->size,in_R8);
    pbVar2 = pbVar1;
  } while (pbVar1 != (base_block_t *)0x0);
  return;
}

Assistant:

void
base_delete(tsdn_t *tsdn, base_t *base) {
	ehooks_t *ehooks = base_ehooks_get_for_metadata(base);
	base_block_t *next = base->blocks;
	do {
		base_block_t *block = next;
		next = block->next;
		base_unmap(tsdn, ehooks, base_ind_get(base), block,
		    block->size);
	} while (next != NULL);
}